

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O2

int pigpio_start(char *addrStr,char *portStr)

{
  int iVar1;
  undefined4 uVar2;
  uint32_t uVar3;
  ssize_t sVar4;
  int *userdata;
  pthread_t *ppVar5;
  int pi;
  long lVar6;
  pthread_mutex_t *__mutex;
  pthread_t **pppVar7;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pppVar7 = gPthNotify;
  __mutex = gCmdMutex;
  pi = 0;
  lVar6 = 0;
  while( true ) {
    if (lVar6 == 0x80) {
      return -0x7dc;
    }
    if (*(int *)((long)gPiInUse + lVar6) == 0) break;
    pppVar7 = pppVar7 + 1;
    lVar6 = lVar6 + 4;
    __mutex = __mutex + 1;
    pi = pi + 1;
  }
  *(undefined4 *)((long)gPiInUse + lVar6) = 1;
  if (((addrStr == (char *)0x0) || (*addrStr == '\0')) &&
     ((addrStr = getenv("PIGPIO_ADDR"), addrStr == (char *)0x0 || (*addrStr == '\0')))) {
    addrStr = "localhost";
  }
  if (((portStr == (char *)0x0) || (*portStr == '\0')) &&
     ((portStr = getenv("PIGPIO_PORT"), portStr == (char *)0x0 || (*portStr == '\0')))) {
    portStr = "8888";
  }
  pthread_mutex_init((pthread_mutex_t *)__mutex,(pthread_mutexattr_t *)0x0);
  iVar1 = pigpioOpenSocket(addrStr,portStr);
  *(int *)((long)gPigCommand + lVar6) = iVar1;
  if (iVar1 < 0) {
    return iVar1;
  }
  iVar1 = pigpioOpenSocket(addrStr,portStr);
  *(int *)((long)gPigNotify + lVar6) = iVar1;
  if (iVar1 < 0) {
    return iVar1;
  }
  if (*(int *)((long)gPiInUse + lVar6) == 0) {
    uVar2 = 0xfffff825;
  }
  else {
    local_48 = 99;
    uStack_40 = 0;
    _pml(pi);
    sVar4 = send(*(int *)((long)gPigNotify + lVar6),&local_48,0x10,0);
    if (sVar4 == 0x10) {
      sVar4 = recv(*(int *)((long)gPigNotify + lVar6),&local_48,0x10,0x100);
      _pmu(pi);
      uVar2 = 0xfffff82f;
      if (sVar4 == 0x10) {
        *(undefined4 *)((long)gPigHandle + lVar6) = uStack_40._4_4_;
        if (uStack_40 < 0) {
          return -0x7d5;
        }
        uVar3 = read_bank_1(pi);
        *(uint32_t *)((long)gLastLevel + lVar6) = uVar3;
        userdata = (int *)malloc(4);
        *userdata = pi;
        ppVar5 = start_thread(pthNotifyThread,userdata);
        *pppVar7 = ppVar5;
        if (ppVar5 != (pthread_t *)0x0) {
          return pi;
        }
        return -0x7d9;
      }
    }
    else {
      _pmu(pi);
      uVar2 = 0xfffff830;
    }
  }
  *(undefined4 *)((long)gPigHandle + lVar6) = uVar2;
  return -0x7d5;
}

Assistant:

int pigpio_start(char *addrStr, char *portStr)
{
   int pi;
   int *userdata;

   for (pi=0; pi<MAX_PI; pi++)
   {
      if (!gPiInUse[pi]) break;
   }

   if (pi >= MAX_PI) return pigif_too_many_pis;

   gPiInUse[pi] = 1;

   if ((!addrStr)  || (!strlen(addrStr)))
   {
      addrStr = getenv(PI_ENVADDR);

      if ((!addrStr) || (!strlen(addrStr)))
      {
         addrStr = PI_DEFAULT_SOCKET_ADDR_STR;
      }
   }

   if ((!portStr) || (!strlen(portStr)))
   {
      portStr = getenv(PI_ENVPORT);

      if ((!portStr) || (!strlen(portStr)))
      {
         portStr = PI_DEFAULT_SOCKET_PORT_STR;
      }
   }

   pthread_mutex_init(&gCmdMutex[pi], NULL);

   gPigCommand[pi] = pigpioOpenSocket(addrStr, portStr);

   if (gPigCommand[pi] >= 0)
   {
      gPigNotify[pi] = pigpioOpenSocket(addrStr, portStr);

      if (gPigNotify[pi] >= 0)
      {
         gPigHandle[pi] = pigpio_notify(pi);

         if (gPigHandle[pi] < 0) return pigif_bad_noib;
         else
         {
            gLastLevel[pi] = read_bank_1(pi);

            /* must be freed by pthNotifyThread */
            userdata = malloc(sizeof(*userdata));
            *userdata = pi;

            gPthNotify[pi] = start_thread(pthNotifyThread, userdata);

            if (gPthNotify[pi]) return pi;
            else                return pigif_notify_failed;

         }
      }
      else return gPigNotify[pi];
   }
   else return gPigCommand[pi];
}